

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O3

void __thiscall Imf_2_5::OpaqueAttribute::copyValueFrom(OpaqueAttribute *this,Attribute *other)

{
  size_t __n;
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  char *__dest;
  ulong uVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  TypeExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  lVar4 = __dynamic_cast(other,&Attribute::typeinfo,&typeinfo,0);
  if ((lVar4 != 0) && (__n = (this->_typeName)._M_string_length, __n == *(size_t *)(lVar4 + 0x10)))
  {
    if (__n != 0) {
      iVar3 = bcmp((this->_typeName)._M_dataplus._M_p,*(void **)(lVar4 + 8),__n);
      if (iVar3 != 0) goto LAB_0059f650;
    }
    uVar1 = *(ulong *)(lVar4 + 0x28);
    __dest = (char *)operator_new__(uVar1);
    pcVar2 = (this->_data)._data;
    uVar5 = uVar1;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
      uVar5 = *(ulong *)(lVar4 + 0x28);
    }
    (this->_data)._size = uVar1;
    (this->_data)._data = __dest;
    this->_dataSize = uVar5;
    memcpy(__dest,*(void **)(lVar4 + 0x38),*(size_t *)(lVar4 + 0x28));
    return;
  }
LAB_0059f650:
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Cannot copy the value of an image file attribute of type \"",0x3a);
  iVar3 = (*other->_vptr_Attribute[2])(other);
  poVar6 = std::operator<<(local_198,(char *)CONCAT44(extraout_var,iVar3));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" to an attribute of type \"",0x1b);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->_typeName)._M_dataplus._M_p,(this->_typeName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
  this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::TypeExc::TypeExc(this_00,(stringstream *)asStack_1a8);
  __cxa_throw(this_00,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void	
OpaqueAttribute::copyValueFrom (const Attribute &other)
{
    const OpaqueAttribute *oa = dynamic_cast <const OpaqueAttribute *> (&other);

    if (oa == 0 || _typeName != oa->_typeName)
    {
	THROW (IEX_NAMESPACE::TypeExc, "Cannot copy the value of an "
			     "image file attribute of type "
			     "\"" << other.typeName() << "\" "
			     "to an attribute of type "
			     "\"" << _typeName << "\".");
    }

    _data.resizeErase (oa->_dataSize);
    _dataSize = oa->_dataSize;
    memcpy ((char *) _data, (const char *) oa->_data, oa->_dataSize);
}